

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::packRows(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint *puVar5;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  int *l_rbeg;
  int *l_rmax;
  int *l_rlen;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *l_rval;
  int *l_ridx;
  Dring *list;
  Dring *ring;
  int l_row;
  int j;
  int i;
  int n;
  cpp_dec_float<200U,_int,_void> *this_00;
  undefined8 *local_30;
  uint local_20;
  uint local_1c;
  
  lVar1 = *(long *)(in_RDI[7].data._M_elems + 4);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *)0x6daf4e);
  lVar2 = *(long *)(in_RDI[7].data._M_elems + 8);
  lVar3 = *(long *)(in_RDI[7].data._M_elems + 10);
  this_00 = *(cpp_dec_float<200U,_int,_void> **)(in_RDI[7].data._M_elems + 6);
  local_1c = 0;
  puVar5 = in_RDI[6].data._M_elems + 0x14;
  for (local_30 = *(undefined8 **)puVar5; (uint *)local_30 != puVar5;
      local_30 = (undefined8 *)*local_30) {
    iVar4 = *(int *)(local_30 + 2);
    if ((this_00->data)._M_elems[iVar4] != local_1c) goto LAB_006dafd3;
    local_1c = *(int *)(lVar2 + (long)iVar4 * 4) + local_1c;
    *(undefined4 *)(lVar3 + (long)iVar4 * 4) = *(undefined4 *)(lVar2 + (long)iVar4 * 4);
  }
LAB_006db109:
  *(undefined4 *)
   (*(long *)(in_RDI[7].data._M_elems + 10) + (long)(int)(in_RDI->data)._M_elems[1] * 4) = 0;
  *(uint *)&in_RDI[6].neg = local_1c;
  return;
LAB_006dafd3:
  do {
    iVar4 = *(int *)(local_30 + 2);
    local_20 = (this_00->data)._M_elems[iVar4];
    (this_00->data)._M_elems[iVar4] = local_1c;
    *(undefined4 *)(lVar3 + (long)iVar4 * 4) = *(undefined4 *)(lVar2 + (long)iVar4 * 4);
    iVar4 = local_20 + *(int *)(lVar2 + (long)iVar4 * 4);
    for (; (int)local_20 < iVar4; local_20 = local_20 + 1) {
      *(undefined4 *)(lVar1 + (long)(int)local_1c * 4) =
           *(undefined4 *)(lVar1 + (long)(int)local_20 * 4);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,in_RDI);
      local_1c = local_1c + 1;
    }
    local_30 = (undefined8 *)*local_30;
  } while ((uint *)local_30 != puVar5);
  goto LAB_006db109;
}

Assistant:

void CLUFactor<R>::packRows()
{
   int n, i, j, l_row;
   Dring* ring, *list;

   int* l_ridx = u.row.idx;
   R* l_rval = u.row.val.data();
   int* l_rlen = u.row.len;
   int* l_rmax = u.row.max;
   int* l_rbeg = u.row.start;

   n = 0;
   list = &(u.row.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_row = ring->idx;

      if(l_rbeg[l_row] != n)
      {
         do
         {
            l_row = ring->idx;
            i = l_rbeg[l_row];
            assert(l_rlen[l_row] <= l_rmax[l_row]);
            l_rbeg[l_row] = n;
            l_rmax[l_row] = l_rlen[l_row];
            j = i + l_rlen[l_row];

            for(; i < j; ++i, ++n)
            {
               assert(n <= i);
               l_ridx[n] = l_ridx[i];
               l_rval[n] = l_rval[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackRows;
      }

      n += l_rlen[l_row];

      l_rmax[l_row] = l_rlen[l_row];
   }

terminatePackRows:

   u.row.max[thedim] = 0;
   u.row.used = n;
}